

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O2

void TPZShapeHDivConstant<pzshape::TPZShapeTriang>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *divphi)

{
  TPZFNMatrix<180,_double> *this;
  double dVar1;
  int iVar2;
  int64_t iVar3;
  uint uVar4;
  double *pdVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong col;
  long lVar9;
  int64_t local_190;
  TPZVec<double> div;
  double local_130;
  TPZFNMatrix<12,_double> vecDiv;
  
  TPZFNMatrix<12,_double>::TPZFNMatrix(&vecDiv,2,3);
  TPZVec<double>::TPZVec(&div,3);
  memset(vecDiv.super_TPZFMatrix<double>.fElem,0,
         vecDiv.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         vecDiv.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  vecDiv.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_130 = 0.0;
  TPZVec<double>::Fill(&div,&local_130,0,-1);
  pztopology::TPZTriangle::ComputeConstantHDiv(pt,&vecDiv.super_TPZFMatrix<double>,&div);
  iVar3 = (data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
  TPZShapeH1<pzshape::TPZShapeTriang>::Shape(pt,data);
  (*(divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])();
  uVar4 = pztopology::TPZTriangle::NumSides(1);
  this = &data->fDPhi;
  col = 0;
  uVar6 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar6 = col;
  }
  lVar8 = 3;
  iVar7 = 0;
  while( true ) {
    local_190 = (int64_t)iVar7;
    if (col == uVar6) break;
    pdVar5 = TPZFMatrix<double>::operator()(&vecDiv.super_TPZFMatrix<double>,0,col);
    dVar1 = *pdVar5;
    iVar2 = (data->fSideOrient).super_TPZVec<int>.fStore[col];
    pdVar5 = TPZFMatrix<double>::operator()(phi,0,local_190);
    *pdVar5 = dVar1 * (double)iVar2;
    pdVar5 = TPZFMatrix<double>::operator()(&vecDiv.super_TPZFMatrix<double>,1,col);
    dVar1 = *pdVar5;
    iVar2 = (data->fSideOrient).super_TPZVec<int>.fStore[col];
    pdVar5 = TPZFMatrix<double>::operator()(phi,1,local_190);
    *pdVar5 = dVar1 * (double)iVar2;
    dVar1 = div.fStore[col];
    iVar2 = (data->fSideOrient).super_TPZVec<int>.fStore[col];
    pdVar5 = TPZFMatrix<double>::operator()(divphi,local_190,0);
    lVar8 = (long)(int)lVar8;
    *pdVar5 = dVar1 * (double)iVar2;
    for (lVar9 = 1; (int)lVar9 < (data->fHDivConnectOrders).super_TPZVec<int>.fStore[col];
        lVar9 = lVar9 + 1) {
      pdVar5 = TPZFMatrix<double>::operator()(&this->super_TPZFMatrix<double>,1,lVar8);
      dVar1 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(phi,0,local_190 + lVar9);
      *pdVar5 = -dVar1;
      pdVar5 = TPZFMatrix<double>::operator()(&this->super_TPZFMatrix<double>,0,lVar8);
      dVar1 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(phi,1,local_190 + lVar9);
      *pdVar5 = dVar1;
      lVar8 = lVar8 + 1;
    }
    iVar7 = iVar7 + (int)lVar9;
    col = col + 1;
  }
  for (lVar8 = (long)(int)lVar8; (int)lVar8 < (int)iVar3; lVar8 = lVar8 + 1) {
    pdVar5 = TPZFMatrix<double>::operator()(&this->super_TPZFMatrix<double>,1,lVar8);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(phi,0,local_190);
    *pdVar5 = -dVar1;
    pdVar5 = TPZFMatrix<double>::operator()(&this->super_TPZFMatrix<double>,0,lVar8);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(phi,1,local_190);
    *pdVar5 = dVar1;
    local_190 = local_190 + 1;
  }
  TPZVec<double>::~TPZVec(&div);
  TPZFNMatrix<12,_double>::~TPZFNMatrix(&vecDiv);
  return;
}

Assistant:

void TPZShapeHDivConstant<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &divphi)
{

    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    const int nfacets = TSHAPE::NFacets;

    // Compute constant Hdiv functions
    TPZFNMatrix<12,REAL> vecDiv(dim,nfacets);
    TPZVec<REAL> div(nfacets);
    vecDiv.Zero();
    div.Fill(0.);
    // std::cout << "FSide trans ID = " << data.fSideTransformationId << std::endl;
    TSHAPE::ComputeConstantHDiv(pt, vecDiv, div);

    int nshape = data.fPhi.Rows();
    
    if (dim == 2){
        TPZShapeH1<TSHAPE>::Shape(pt,data);    
        divphi.Zero();
        const auto nEdges = TSHAPE::NumSides(1);

        int count = 0;
        int countKernel=ncorner;
        //Edge functions
        for (int i = 0; i < nEdges; i++)
        {
            //RT0 Function
            phi(0,count) = vecDiv(0,i) * data.fSideOrient[i];
            phi(1,count) = vecDiv(1,i) * data.fSideOrient[i];
            divphi(count,0) = div[i] * data.fSideOrient[i];
            count++;

            //Kernel Hdiv
            for (int j = 1; j < data.fHDivConnectOrders[i]; j++)
            {
                phi(0,count) = -data.fDPhi(1,countKernel);
                phi(1,count) =  data.fDPhi(0,countKernel);
                count++;
                countKernel++;
            }
        }
        
        //Internal functions
        for (int i = countKernel; i < nshape; i++){
            phi(0,count) = -data.fDPhi(1,countKernel);
            phi(1,count) =  data.fDPhi(0,countKernel);
            count++;
            countKernel++;
        }
    } else if (dim == 3){
        
        divphi.Zero();
        const auto nEdges = TSHAPE::NumSides(1);
        int nshapehcurl = TPZShapeHCurlNoGrads<TSHAPE>::NHCurlShapeF(data);
        int nshape = NHDivShapeF(data);
        
        TPZFMatrix<REAL> phiAux(dim,nshapehcurl),curlPhiAux(3,nshapehcurl);
        phiAux.Zero(); curlPhiAux.Zero();

        TPZShapeHCurlNoGrads<TSHAPE>::Shape(pt,data,phiAux,curlPhiAux);
        
        int count = 0;
        int countKernel=nEdges;

        //Face functions
        for (int i = 0; i < nfacets; i++)
        {
            // std::cout << "Side orient - " << i << " " << data.fSideOrient[i] << std::endl;
            //RT0 Function
            for(auto d = 0; d < dim; d++) {
                phi(d,count) = vecDiv(d,i) * data.fSideOrient[i];
            }
            divphi(count,0) = div[i] * data.fSideOrient[i];
            count++;
        
            //Kernel HDiv functions
            for (int k = 0; k < data.fHDivNumConnectShape[nEdges]; k++){
                for(auto d = 0; d < dim; d++) {
                    phi(d,count) = curlPhiAux(d,countKernel);               
                }
                countKernel++;
                count++;
            }
        }
        //Internal Functions - HDivKernel
        for (int i = 0; i < data.fHDivNumConnectShape[TSHAPE::NSides-TSHAPE::NCornerNodes-1]; i++)
        {
            for (auto d = 0; d < dim; d++)
            {
                phi(d,count) = curlPhiAux(d,countKernel);  
            }
            countKernel++;
            count++;
        }
        // std::cout << "VecDiv = " << vecDiv << std::endl;
        // std::cout << "divphi = " << divphi << std::endl;
        // std::cout << "phi = " << phi << std::endl;
    } else {
        DebugStop();
    }
    

}